

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantsTests.cpp
# Opt level: O0

void __thiscall ConstantsTest_Values_Test<float>::TestBody(ConstantsTest_Values_Test<float> *this)

{
  bool bVar1;
  AssertHelper *this_00;
  char *pcVar2;
  AssertionResult *pAVar3;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  AssertHelper *in_stack_fffffffffffffda0;
  float *in_stack_fffffffffffffda8;
  AssertionResult *this_01;
  undefined7 in_stack_fffffffffffffdb0;
  undefined1 in_stack_fffffffffffffdb7;
  undefined1 uVar4;
  char *in_stack_fffffffffffffdb8;
  int line;
  char *in_stack_fffffffffffffdc0;
  Type in_stack_fffffffffffffdcc;
  Type type;
  AssertHelper *in_stack_fffffffffffffdd0;
  undefined7 in_stack_fffffffffffffdf8;
  undefined1 in_stack_fffffffffffffdff;
  undefined1 uVar5;
  AssertHelper *in_stack_fffffffffffffe00;
  AssertionResult local_170 [2];
  float local_150;
  undefined4 local_14c;
  AssertionResult local_148 [2];
  float local_128;
  undefined4 local_124;
  AssertionResult local_120 [2];
  float local_100;
  undefined4 local_fc;
  AssertionResult local_f8 [2];
  float local_d8;
  undefined4 local_d4;
  AssertionResult local_d0 [2];
  float local_b0;
  undefined4 local_ac;
  AssertionResult local_a8 [2];
  float local_88;
  undefined4 local_84;
  AssertionResult local_80 [2];
  undefined4 local_5c;
  AssertionResult local_58;
  uint local_44;
  char local_38 [24];
  float local_20;
  undefined4 local_1c;
  AssertionResult local_18;
  
  local_1c = 0x40490fdb;
  local_20 = pica::Constants<float>::pi();
  pcVar2 = "static_cast<TypeParam>(constants::pi)";
  testing::internal::EqHelper<false>::Compare<float,float>
            (in_stack_fffffffffffffdb8,
             (char *)CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0),
             in_stack_fffffffffffffda8,(float *)in_stack_fffffffffffffda0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffdd0);
    testing::AssertionResult::failure_message((AssertionResult *)0x1d2b38);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc0,
               (int)((ulong)in_stack_fffffffffffffdb8 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0));
    pcVar2 = local_38;
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffe00,
               (Message *)CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8));
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffda0);
    testing::Message::~Message((Message *)0x1d2b9b);
  }
  local_44 = (uint)!bVar1;
  pAVar3 = &local_18;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d2c09);
  if (local_44 == 0) {
    local_5c = 0x50df5ce0;
    pica::Constants<float>::c(pAVar3,pcVar2);
    testing::internal::EqHelper<false>::Compare<float,float>
              (in_stack_fffffffffffffdb8,
               (char *)CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0),
               in_stack_fffffffffffffda8,(float *)in_stack_fffffffffffffda0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_58);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffdd0);
      testing::AssertionResult::failure_message((AssertionResult *)0x1d2cd6);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc0,
                 (int)((ulong)in_stack_fffffffffffffdb8 >> 0x20),
                 (char *)CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0));
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffe00,
                 (Message *)CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8));
      testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffda0);
      testing::Message::~Message((Message *)0x1d2d39);
    }
    local_44 = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d2da7);
    if (local_44 == 0) {
      local_84 = 0x50df5ce0;
      local_88 = pica::Constants<float>::lightVelocity();
      testing::internal::EqHelper<false>::Compare<float,float>
                (in_stack_fffffffffffffdb8,
                 (char *)CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0),
                 in_stack_fffffffffffffda8,(float *)in_stack_fffffffffffffda0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_80);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffdd0);
        testing::AssertionResult::failure_message((AssertionResult *)0x1d2e74);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc0,
                   (int)((ulong)in_stack_fffffffffffffdb8 >> 0x20),
                   (char *)CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0));
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffe00,
                   (Message *)CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8));
        testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffda0);
        testing::Message::~Message((Message *)0x1d2ed7);
      }
      local_44 = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d2f45);
      if (local_44 == 0) {
        local_ac = 0xb004078c;
        local_b0 = pica::Constants<float>::electronCharge();
        testing::internal::EqHelper<false>::Compare<float,float>
                  (in_stack_fffffffffffffdb8,
                   (char *)CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0),
                   in_stack_fffffffffffffda8,(float *)in_stack_fffffffffffffda0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(local_a8);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffffdd0);
          testing::AssertionResult::failure_message((AssertionResult *)0x1d3012);
          testing::internal::AssertHelper::AssertHelper
                    (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc0,
                     (int)((ulong)in_stack_fffffffffffffdb8 >> 0x20),
                     (char *)CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0));
          testing::internal::AssertHelper::operator=
                    (in_stack_fffffffffffffe00,
                     (Message *)CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8));
          testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffda0);
          testing::Message::~Message((Message *)0x1d3075);
        }
        local_44 = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d30e3);
        if (local_44 == 0) {
          local_d4 = 0x1290580b;
          local_d8 = pica::Constants<float>::electronMass();
          testing::internal::EqHelper<false>::Compare<float,float>
                    (in_stack_fffffffffffffdb8,
                     (char *)CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0),
                     in_stack_fffffffffffffda8,(float *)in_stack_fffffffffffffda0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool(local_d0);
          if (!bVar1) {
            testing::Message::Message((Message *)in_stack_fffffffffffffdd0);
            in_stack_fffffffffffffe00 =
                 (AssertHelper *)
                 testing::AssertionResult::failure_message((AssertionResult *)0x1d31a4);
            testing::internal::AssertHelper::AssertHelper
                      (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc0
                       ,(int)((ulong)in_stack_fffffffffffffdb8 >> 0x20),
                       (char *)CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0));
            testing::internal::AssertHelper::operator=
                      (in_stack_fffffffffffffe00,
                       (Message *)CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8));
            testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffda0);
            testing::Message::~Message((Message *)0x1d3201);
          }
          local_44 = (uint)!bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d326f);
          if (local_44 == 0) {
            local_fc = 0x180169b6;
            local_100 = pica::Constants<float>::protonMass();
            testing::internal::EqHelper<false>::Compare<float,float>
                      (in_stack_fffffffffffffdb8,
                       (char *)CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0),
                       in_stack_fffffffffffffda8,(float *)in_stack_fffffffffffffda0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool(local_f8);
            uVar5 = bVar1;
            if (!bVar1) {
              testing::Message::Message((Message *)in_stack_fffffffffffffdd0);
              testing::AssertionResult::failure_message((AssertionResult *)0x1d3330);
              testing::internal::AssertHelper::AssertHelper
                        (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdcc,
                         in_stack_fffffffffffffdc0,(int)((ulong)in_stack_fffffffffffffdb8 >> 0x20),
                         (char *)CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0));
              testing::internal::AssertHelper::operator=
                        (in_stack_fffffffffffffe00,
                         (Message *)CONCAT17(uVar5,in_stack_fffffffffffffdf8));
              testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffda0);
              testing::Message::~Message((Message *)0x1d338d);
            }
            local_44 = (uint)!bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d33fb);
            if (local_44 == 0) {
              local_124 = 0x12a71a82;
              local_128 = pica::Constants<float>::planck();
              testing::internal::EqHelper<false>::Compare<float,float>
                        (in_stack_fffffffffffffdb8,
                         (char *)CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0),
                         in_stack_fffffffffffffda8,(float *)in_stack_fffffffffffffda0);
              bVar1 = testing::AssertionResult::operator_cast_to_bool(local_120);
              if (!bVar1) {
                testing::Message::Message((Message *)in_stack_fffffffffffffdd0);
                in_stack_fffffffffffffdd0 =
                     (AssertHelper *)
                     testing::AssertionResult::failure_message((AssertionResult *)0x1d34bc);
                testing::internal::AssertHelper::AssertHelper
                          (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdcc,
                           in_stack_fffffffffffffdc0,(int)((ulong)in_stack_fffffffffffffdb8 >> 0x20)
                           ,(char *)CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0));
                testing::internal::AssertHelper::operator=
                          (in_stack_fffffffffffffe00,
                           (Message *)CONCAT17(uVar5,in_stack_fffffffffffffdf8));
                testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffda0);
                testing::Message::~Message((Message *)0x1d3519);
              }
              local_44 = (uint)!bVar1;
              testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d3587);
              if (local_44 == 0) {
                local_14c = 0x2be17c7f;
                local_150 = pica::Constants<float>::eV();
                pAVar3 = local_148;
                testing::internal::EqHelper<false>::Compare<float,float>
                          (in_stack_fffffffffffffdb8,
                           (char *)CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0),
                           in_stack_fffffffffffffda8,(float *)in_stack_fffffffffffffda0);
                bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar3);
                type = CONCAT13(bVar1,(int3)in_stack_fffffffffffffdcc);
                if (!bVar1) {
                  testing::Message::Message((Message *)in_stack_fffffffffffffdd0);
                  in_stack_fffffffffffffdb8 =
                       testing::AssertionResult::failure_message((AssertionResult *)0x1d3648);
                  testing::internal::AssertHelper::AssertHelper
                            (in_stack_fffffffffffffdd0,type,&pAVar3->success_,
                             (int)((ulong)in_stack_fffffffffffffdb8 >> 0x20),
                             (char *)CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0));
                  testing::internal::AssertHelper::operator=
                            (in_stack_fffffffffffffe00,
                             (Message *)CONCAT17(uVar5,in_stack_fffffffffffffdf8));
                  testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffda0);
                  testing::Message::~Message((Message *)0x1d36a5);
                }
                local_44 = (uint)!bVar1;
                testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d3713);
                if (local_44 == 0) {
                  pica::Constants<float>::meV();
                  this_01 = local_170;
                  testing::internal::EqHelper<false>::Compare<float,float>
                            (in_stack_fffffffffffffdb8,
                             (char *)CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0),
                             (float *)this_01,(float *)in_stack_fffffffffffffda0);
                  line = (int)((ulong)in_stack_fffffffffffffdb8 >> 0x20);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_01);
                  if (!bVar1) {
                    uVar4 = bVar1;
                    testing::Message::Message((Message *)in_stack_fffffffffffffdd0);
                    this_00 = (AssertHelper *)
                              testing::AssertionResult::failure_message((AssertionResult *)0x1d37d4)
                    ;
                    testing::internal::AssertHelper::AssertHelper
                              (in_stack_fffffffffffffdd0,type,&pAVar3->success_,line,
                               (char *)CONCAT17(uVar4,in_stack_fffffffffffffdb0));
                    testing::internal::AssertHelper::operator=
                              (in_stack_fffffffffffffe00,
                               (Message *)CONCAT17(uVar5,in_stack_fffffffffffffdf8));
                    testing::internal::AssertHelper::~AssertHelper(this_00);
                    testing::Message::~Message((Message *)0x1d3831);
                  }
                  local_44 = (uint)!bVar1;
                  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d389c);
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

TYPED_TEST(ConstantsTest, Values)
{
    // Check that all members of Constants<T> can be instantiated for all T in types
    // and are the same as casted corresponding values of constants namespace
    ASSERT_EQ(static_cast<TypeParam>(constants::pi), Constants<TypeParam>::pi());
    ASSERT_EQ(static_cast<TypeParam>(constants::c), Constants<TypeParam>::c());
    ASSERT_EQ(static_cast<TypeParam>(constants::lightVelocity), Constants<TypeParam>::lightVelocity());
    ASSERT_EQ(static_cast<TypeParam>(constants::electronCharge), Constants<TypeParam>::electronCharge());
    ASSERT_EQ(static_cast<TypeParam>(constants::electronMass), Constants<TypeParam>::electronMass());
    ASSERT_EQ(static_cast<TypeParam>(constants::protonMass), Constants<TypeParam>::protonMass());
    ASSERT_EQ(static_cast<TypeParam>(constants::planck), Constants<TypeParam>::planck());
    ASSERT_EQ(static_cast<TypeParam>(constants::eV), Constants<TypeParam>::eV());
    ASSERT_EQ(static_cast<TypeParam>(constants::meV), Constants<TypeParam>::meV());
}